

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blocksort.c
# Opt level: O1

void BZ2_blockSort(EState *s)

{
  int *piVar1;
  byte *pbVar2;
  byte bVar3;
  UInt32 UVar4;
  undefined4 uVar5;
  Bool BVar6;
  UInt32 UVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  Int32 *pIVar12;
  uint *puVar13;
  byte bVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  int iVar18;
  uint uVar19;
  ulong uVar20;
  UInt32 *pUVar21;
  UInt32 *pUVar22;
  UInt32 *pUVar23;
  byte bVar24;
  int iVar25;
  UInt32 *eclass;
  int iVar26;
  uint uVar27;
  ulong uVar28;
  byte bVar29;
  UInt16 UVar30;
  uint uVar31;
  ushort uVar32;
  Int32 zztmp_1;
  int iVar33;
  int iVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  Int32 zztmp;
  byte *pbVar38;
  int iVar39;
  bool bVar40;
  Int32 budget;
  Bool bigDone [256];
  Int32 stackHi [100];
  Int32 stackLo [100];
  Int32 runningOrder [256];
  Int32 copyStart [256];
  uint local_12ec;
  UInt32 *local_12e8;
  long local_12e0;
  int local_12d4;
  ulong local_12d0;
  byte *local_12c8;
  uint local_12bc;
  ulong local_12b8;
  long local_12b0;
  UInt16 *local_12a8;
  int local_129c;
  int local_1298;
  int local_1294;
  ulong local_1290;
  long local_1288;
  ulong local_1280;
  long local_1278;
  ulong local_1270;
  int local_1264;
  int local_1260;
  int local_125c;
  ulong local_1258;
  long local_1250;
  long local_1248;
  EState *local_1240;
  ulong local_1238;
  ulong local_1230;
  ulong local_1228;
  ulong local_1220;
  UInt32 *local_1218;
  ulong local_1210;
  UInt32 *local_1208;
  UInt32 *local_1200;
  UInt32 *local_11f8;
  ulong local_11f0;
  char local_11e8 [256];
  int local_10e8 [100];
  uint local_f58 [100];
  uint local_dc8 [100];
  uint auStack_c38 [256];
  int aiStack_838 [256];
  uint auStack_438 [258];
  
  pUVar22 = s->ftab;
  pUVar23 = s->ptr;
  uVar9 = s->nblock;
  lVar16 = (long)(int)uVar9;
  iVar8 = s->verbosity;
  if (lVar16 < 10000) {
    pUVar21 = s->arr1;
    eclass = s->arr2;
  }
  else {
    pbVar38 = s->block;
    iVar18 = 1;
    if (1 < s->workFactor) {
      iVar18 = s->workFactor;
    }
    iVar25 = 100;
    if (iVar18 < 100) {
      iVar25 = iVar18;
    }
    uVar20 = (ulong)(uVar9 + (uVar9 & 1) + 0x22);
    local_12ec = ((iVar25 - 1U) / 3) * uVar9;
    local_1210 = (ulong)local_12ec;
    local_12d4 = iVar8;
    local_1240 = s;
    if (3 < iVar8) {
      BZ2_blockSort_cold_1();
    }
    local_12a8 = (UInt16 *)(pbVar38 + uVar20);
    memset(pUVar22,0,0x40004);
    local_1258 = (ulong)(uVar9 - 1);
    bVar14 = *pbVar38;
    lVar10 = local_1258 + 4;
    uVar28 = local_1258;
    do {
      (pbVar38 + lVar10 * 2 + (uVar20 - 8))[0] = 0;
      (pbVar38 + lVar10 * 2 + (uVar20 - 8))[1] = 0;
      bVar29 = pbVar38[lVar10 + -4];
      pUVar22[CONCAT11(bVar29,bVar14)] = pUVar22[CONCAT11(bVar29,bVar14)] + 1;
      (pbVar38 + lVar10 * 2 + (uVar20 - 10))[0] = 0;
      (pbVar38 + lVar10 * 2 + (uVar20 - 10))[1] = 0;
      bVar14 = pbVar38[lVar10 + -5];
      piVar1 = (int *)((long)pUVar22 + (ulong)((uint)bVar14 * 0x400 + (uint)bVar29 * 4));
      *piVar1 = *piVar1 + 1;
      (pbVar38 + lVar10 * 2 + (uVar20 - 0xc))[0] = 0;
      (pbVar38 + lVar10 * 2 + (uVar20 - 0xc))[1] = 0;
      bVar29 = pbVar38[lVar10 + -6];
      piVar1 = (int *)((long)pUVar22 + (ulong)((uint)bVar29 * 0x400 + (uint)bVar14 * 4));
      *piVar1 = *piVar1 + 1;
      (pbVar38 + lVar10 * 2 + (uVar20 - 0xe))[0] = 0;
      (pbVar38 + lVar10 * 2 + (uVar20 - 0xe))[1] = 0;
      bVar14 = pbVar38[lVar10 + -7];
      uVar17 = (ulong)CONCAT11(bVar14,bVar29);
      pUVar22[uVar17] = pUVar22[uVar17] + 1;
      uVar28 = (ulong)((int)uVar28 - 4);
      lVar10 = lVar10 + -4;
    } while (6 < lVar10);
    if (3 < lVar10) {
      lVar10 = uVar28 + 1;
      do {
        local_12a8[lVar10 + -1] = 0;
        uVar15 = (uint)pbVar38[lVar10 + -1] << 8 | (uint)(uVar17 >> 8);
        pUVar22[uVar15] = pUVar22[uVar15] + 1;
        uVar17 = (ulong)uVar15;
        lVar11 = lVar10 + -1;
        bVar40 = 0 < lVar10;
        lVar10 = lVar11;
      } while (lVar11 != 0 && bVar40);
    }
    lVar10 = 0;
    do {
      pbVar38[lVar10 + lVar16] = pbVar38[lVar10];
      (pbVar38 + lVar10 * 2 + uVar20 + lVar16 * 2)[0] = 0;
      (pbVar38 + lVar10 * 2 + uVar20 + lVar16 * 2)[1] = 0;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x22);
    local_12e0 = lVar16;
    if (3 < local_12d4) {
      BZ2_blockSort_cold_2();
    }
    UVar7 = *pUVar22;
    lVar16 = 1;
    do {
      UVar7 = UVar7 + pUVar22[lVar16];
      pUVar22[lVar16] = UVar7;
      lVar16 = lVar16 + 1;
    } while (lVar16 != 0x10001);
    uVar32 = (ushort)*pbVar38 << 8;
    iVar8 = -1;
    iVar18 = -4;
    iVar25 = -3;
    iVar26 = -2;
    uVar20 = local_1258 & 0xffffffff;
    do {
      uVar28 = uVar20;
      bVar14 = pbVar38[uVar28];
      uVar32 = (ushort)bVar14 << 8 | uVar32 >> 8;
      UVar7 = pUVar22[uVar32];
      pUVar22[uVar32] = UVar7 - 1;
      pUVar23[(int)(UVar7 - 1)] = uVar9 + iVar8;
      bVar29 = pbVar38[uVar28 - 1];
      uVar32 = CONCAT11(bVar29,bVar14);
      UVar7 = pUVar22[uVar32];
      pUVar22[uVar32] = UVar7 - 1;
      pUVar23[(int)(UVar7 - 1)] = uVar9 + iVar26;
      bVar14 = pbVar38[uVar28 - 2];
      uVar32 = CONCAT11(bVar14,bVar29);
      UVar7 = pUVar22[uVar32];
      pUVar22[uVar32] = UVar7 - 1;
      pUVar23[(int)(UVar7 - 1)] = uVar9 + iVar25;
      uVar32 = CONCAT11(pbVar38[uVar28 - 3],bVar14);
      UVar7 = pUVar22[uVar32];
      pUVar22[uVar32] = UVar7 - 1;
      pUVar23[(int)(UVar7 - 1)] = uVar9 + iVar18;
      iVar8 = iVar8 + -4;
      iVar18 = iVar18 + -4;
      iVar25 = iVar25 + -4;
      iVar26 = iVar26 + -4;
      uVar20 = uVar28 - 4;
    } while (6 < (long)uVar28);
    if (3 < (long)uVar28) {
      uVar9 = iVar8 + uVar9;
      lVar16 = (ulong)uVar9 + 1;
      do {
        uVar32 = uVar32 >> 8 | (ushort)pbVar38[lVar16 + -1] << 8;
        UVar7 = pUVar22[uVar32];
        pUVar22[uVar32] = UVar7 - 1;
        pUVar23[(int)(UVar7 - 1)] = uVar9;
        uVar9 = uVar9 - 1;
        lVar10 = lVar16 + -1;
        bVar40 = 0 < lVar16;
        lVar16 = lVar10;
      } while (lVar10 != 0 && bVar40);
    }
    lVar16 = 0;
    local_12e8 = pUVar23;
    memset(local_11e8,0,0x100);
    do {
      auStack_c38[lVar16] = (uint)lVar16;
      lVar16 = lVar16 + 1;
    } while (lVar16 != 0x100);
    iVar8 = 0x16c;
    do {
      iVar18 = iVar8 / 3;
      if (iVar8 < 0x300) {
        uVar20 = (ulong)iVar18;
        iVar25 = 0xff;
        if (0xff < iVar18) {
          iVar25 = iVar18;
        }
        iVar26 = 0;
        do {
          uVar9 = auStack_c38[uVar20];
          iVar33 = uVar9 * 0x100;
          UVar7 = pUVar22[iVar33 + 0x100];
          UVar4 = pUVar22[iVar33];
          iVar33 = iVar26;
          do {
            iVar34 = iVar18 + iVar33;
            iVar39 = auStack_c38[iVar33] * 0x100;
            if (pUVar22[iVar39 + 0x100] - pUVar22[iVar39] <= UVar7 - UVar4) goto LAB_0041e2c6;
            auStack_c38[iVar34] = auStack_c38[iVar33];
            iVar34 = iVar33 - iVar18;
            bVar40 = iVar18 <= iVar33;
            iVar33 = iVar34;
          } while (bVar40);
          iVar34 = iVar34 + iVar18;
LAB_0041e2c6:
          auStack_c38[iVar34] = uVar9;
          uVar20 = uVar20 + 1;
          iVar26 = iVar26 + 1;
        } while (uVar20 != iVar25 + 1);
      }
      uVar9 = iVar8 - 3;
      iVar8 = iVar18;
    } while (2 < uVar9);
    local_1200 = pUVar22 + 1;
    local_1208 = local_12e8 + -1;
    lVar16 = 0;
    local_1290 = 0;
    pUVar23 = local_12e8;
    s = local_1240;
    local_12c8 = pbVar38;
    local_1218 = pUVar22;
    do {
      uVar9 = auStack_c38[lVar16];
      uVar20 = (ulong)uVar9;
      lVar10 = (long)(int)uVar9;
      local_1264 = uVar9 << 8;
      local_1250 = (long)local_1264;
      pUVar21 = pUVar22 + local_1250;
      uVar28 = 0;
      iVar8 = local_12d4;
      local_1278 = lVar10;
      local_1248 = lVar16;
      local_1238 = uVar20;
      local_11f8 = pUVar21;
      do {
        if (uVar28 != uVar20) {
          uVar9 = pUVar21[uVar28];
          if ((uVar9 >> 0x15 & 1) == 0) {
            uVar15 = (pUVar21[uVar28 + 1] & 0xffdfffff) - 1;
            local_1220 = (ulong)uVar15;
            bVar40 = true;
            local_12bc = uVar9;
            if ((int)uVar9 < (int)uVar15) {
              local_1230 = uVar28;
              if (3 < iVar8) {
                fprintf(_stderr,"        qsort [0x%x, 0x%x]   done %d   this %d\n",local_1238,uVar28
                        ,local_1290,(ulong)((pUVar21[uVar28 + 1] & 0xffdfffff) - uVar9));
              }
              local_dc8[0] = local_12bc;
              local_f58[0] = (uint)local_1220;
              local_10e8[0] = 2;
              local_12d0 = 1;
              bVar40 = true;
              do {
                local_1270 = (ulong)((int)local_12d0 - 1);
LAB_0041e40d:
                uVar20 = local_1270;
                if (0x61 < (uint)local_12d0) {
                  BZ2_bz__AssertH__fail(0x3e9);
                }
                uVar9 = local_dc8[uVar20];
                local_1280 = (ulong)uVar9;
                uVar15 = local_f58[uVar20];
                lVar16 = (long)(int)uVar15;
                iVar8 = local_10e8[uVar20];
                iVar18 = uVar15 - uVar9;
                if ((iVar18 < 0x14) || (0xe < iVar8)) {
                  if (0 < iVar18) {
                    local_1228 = 0xffffffffffffffff;
                    pIVar12 = incs;
                    do {
                      local_1228 = local_1228 + 1;
                      iVar25 = *pIVar12;
                      pIVar12 = pIVar12 + 1;
                    } while (iVar25 <= iVar18);
                    if (local_1228 != 0) {
                      local_125c = uVar9 + 1;
                      local_1260 = uVar9 + 2;
                      local_1288 = lVar16;
                      do {
                        local_11f0 = local_1228;
                        local_1228 = local_1228 - 1;
                        iVar18 = incs[local_1228 & 0xffffffff];
                        local_1294 = (int)local_1280;
                        local_12d0 = CONCAT44(local_12d0._4_4_,iVar18 + local_1294);
                        lVar10 = (long)(iVar18 + local_1294);
                        local_129c = local_1260;
                        local_1298 = local_125c;
                        while (lVar10 <= lVar16) {
                          uVar9 = pUVar23[lVar10];
                          local_12b8 = (ulong)uVar9;
                          iVar25 = local_1294;
                          local_12b0 = lVar10;
                          do {
                            iVar26 = iVar18 + iVar25;
                            UVar7 = pUVar23[iVar25];
                            BVar6 = mainGtU(UVar7 + iVar8,uVar9 + iVar8,local_12c8,local_12a8,
                                            (UInt32)local_12e0,(Int32 *)&local_12ec);
                            pUVar22 = local_12e8;
                            if (BVar6 == '\0') goto LAB_0041e70d;
                            pUVar23[iVar26] = UVar7;
                            iVar26 = iVar25 - iVar18;
                            bVar40 = (int)(uint)local_12d0 <= iVar25;
                            iVar25 = iVar26;
                          } while (bVar40);
                          iVar26 = iVar26 + iVar18;
LAB_0041e70d:
                          local_12e8[iVar26] = (UInt32)local_12b8;
                          pUVar23 = local_12e8;
                          lVar16 = local_1288;
                          if (local_1288 <= local_12b0) break;
                          uVar9 = local_12e8[local_12b0 + 1];
                          local_12b8 = (ulong)uVar9;
                          iVar25 = local_1298;
                          do {
                            iVar26 = iVar18 + iVar25;
                            UVar7 = pUVar22[iVar25];
                            BVar6 = mainGtU(UVar7 + iVar8,uVar9 + iVar8,local_12c8,local_12a8,
                                            (UInt32)local_12e0,(Int32 *)&local_12ec);
                            pUVar23 = local_12e8;
                            if (BVar6 == '\0') goto LAB_0041e793;
                            pUVar22[iVar26] = UVar7;
                            iVar26 = iVar25 - iVar18;
                            bVar40 = (int)(uint)local_12d0 <= iVar25;
                            iVar25 = iVar26;
                          } while (bVar40);
                          iVar26 = iVar26 + iVar18;
LAB_0041e793:
                          local_12e8[iVar26] = (UInt32)local_12b8;
                          lVar16 = local_1288;
                          if (local_1288 < local_12b0 + 2) break;
                          uVar9 = local_12e8[local_12b0 + 2];
                          local_12b8 = (ulong)uVar9;
                          iVar25 = local_129c;
                          do {
                            iVar26 = iVar18 + iVar25;
                            UVar7 = pUVar23[iVar25];
                            BVar6 = mainGtU(UVar7 + iVar8,uVar9 + iVar8,local_12c8,local_12a8,
                                            (UInt32)local_12e0,(Int32 *)&local_12ec);
                            if (BVar6 == '\0') goto LAB_0041e81d;
                            pUVar23[iVar26] = UVar7;
                            iVar26 = iVar25 - iVar18;
                            bVar40 = (int)(uint)local_12d0 <= iVar25;
                            iVar25 = iVar26;
                          } while (bVar40);
                          iVar26 = iVar26 + iVar18;
LAB_0041e81d:
                          local_12e8[iVar26] = (UInt32)local_12b8;
                          lVar10 = local_12b0 + 3;
                          local_1294 = local_1294 + 3;
                          local_1298 = local_1298 + 3;
                          local_129c = local_129c + 3;
                          pUVar23 = local_12e8;
                          lVar16 = local_1288;
                          if ((int)local_12ec < 0) goto LAB_0041e867;
                        }
                      } while (1 < (long)local_11f0);
                    }
                  }
LAB_0041e867:
                  uVar9 = (uint)local_1270;
                  pbVar38 = local_12c8;
                  if (-1 < (int)local_12ec) goto LAB_0041ea14;
                  break;
                }
                lVar10 = (long)(int)uVar9;
                bVar14 = pbVar38[pUVar23[lVar10] + iVar8];
                bVar29 = pbVar38[pUVar23[lVar16] + iVar8];
                bVar24 = bVar29;
                if (bVar14 >= bVar29 && bVar14 != bVar29) {
                  bVar24 = bVar14;
                }
                bVar3 = pbVar38[pUVar23[(int)(uVar15 + uVar9) >> 1] + iVar8];
                if (bVar14 < bVar29) {
                  bVar29 = bVar14;
                }
                if (bVar29 <= bVar3) {
                  bVar29 = bVar3;
                }
                if (bVar24 <= bVar3) {
                  bVar29 = bVar24;
                }
                uVar17 = (ulong)uVar15;
                uVar20 = local_1280;
                uVar28 = local_1280;
                uVar36 = uVar15;
LAB_0041e4ab:
                uVar35 = (uint)uVar28;
                if ((int)uVar35 <= (int)uVar36) {
                  uVar20 = (ulong)(int)uVar20;
                  do {
                    uVar37 = (uint)uVar28;
                    lVar16 = (long)(int)uVar37 + -1;
                    while( true ) {
                      UVar7 = pUVar23[lVar16 + 1];
                      bVar14 = local_12c8[UVar7 + iVar8];
                      uVar35 = (uint)uVar28;
                      if (bVar14 == bVar29) break;
                      pbVar38 = local_12c8;
                      if (bVar29 <= bVar14 && bVar14 != bVar29) goto LAB_0041e512;
                      uVar28 = (ulong)(uVar35 + 1);
                      lVar16 = lVar16 + 1;
                      if ((int)uVar36 <= lVar16) {
                        if ((int)uVar37 <= (int)uVar36) {
                          uVar37 = uVar36;
                        }
                        uVar35 = uVar37 + 1;
                        goto LAB_0041e512;
                      }
                    }
                    pUVar23[lVar16 + 1] = pUVar23[uVar20];
                    pUVar23[uVar20] = UVar7;
                    uVar20 = uVar20 + 1;
                    uVar28 = (ulong)(uVar35 + 1);
                  } while ((int)uVar35 < (int)uVar36);
                  uVar35 = uVar35 + 1;
                  pbVar38 = local_12c8;
                }
LAB_0041e512:
                if ((int)uVar35 <= (int)uVar36) {
                  lVar16 = (long)(int)uVar35;
                  uVar17 = (ulong)(int)uVar17;
                  do {
                    lVar11 = (long)(int)uVar36 + 1;
                    uVar37 = uVar36;
                    while( true ) {
                      UVar7 = pUVar23[lVar11 + -1];
                      if (local_12c8[UVar7 + iVar8] == bVar29) break;
                      if (local_12c8[UVar7 + iVar8] < bVar29) {
                        UVar4 = local_12e8[lVar16];
                        local_12e8[lVar16] = UVar7;
                        local_12e8[lVar11 + -1] = UVar4;
                        uVar36 = uVar37 - 1;
                        uVar28 = (ulong)(uVar35 + 1);
                        pUVar23 = local_12e8;
                        pbVar38 = local_12c8;
                        goto LAB_0041e4ab;
                      }
                      lVar11 = lVar11 + -1;
                      uVar37 = uVar37 - 1;
                      if (lVar11 <= lVar16) {
                        uVar37 = uVar35;
                        if ((int)uVar36 < lVar16) {
                          uVar37 = uVar36;
                        }
                        uVar36 = uVar37 - 1;
                        pbVar38 = local_12c8;
                        goto LAB_0041e5bd;
                      }
                    }
                    local_12e8[lVar11 + -1] = local_12e8[uVar17];
                    local_12e8[uVar17] = UVar7;
                    uVar17 = uVar17 - 1;
                    uVar36 = uVar37 - 1;
                    pUVar23 = local_12e8;
                  } while ((int)uVar35 < (int)uVar37);
                  uVar36 = uVar37 - 1;
                  pbVar38 = local_12c8;
                }
LAB_0041e5bd:
                iVar18 = (int)uVar17;
                iVar25 = (int)uVar20;
                if (iVar18 < iVar25) goto code_r0x0041e5cd;
                iVar26 = uVar35 - iVar25;
                if ((int)(iVar25 - uVar9) < (int)(uVar35 - iVar25)) {
                  iVar26 = iVar25 - uVar9;
                }
                if (0 < iVar26) {
                  iVar33 = iVar26 + 1;
                  lVar16 = 0;
                  do {
                    uVar5 = *(undefined4 *)((long)local_12e8 + lVar16 + lVar10 * 4);
                    *(undefined4 *)((long)local_12e8 + lVar16 + lVar10 * 4) =
                         *(undefined4 *)
                          ((long)local_12e8 + lVar16 + (long)(int)(uVar35 - iVar26) * 4);
                    *(undefined4 *)((long)local_12e8 + lVar16 + (long)(int)(uVar35 - iVar26) * 4) =
                         uVar5;
                    lVar16 = lVar16 + 4;
                    iVar33 = iVar33 + -1;
                  } while (1 < iVar33);
                }
                iVar33 = iVar18 - uVar36;
                iVar26 = uVar15 - iVar18;
                if (iVar33 <= (int)(uVar15 - iVar18)) {
                  iVar26 = iVar33;
                }
                if (0 < iVar26) {
                  iVar18 = iVar26 + 1;
                  pUVar22 = local_12e8;
                  do {
                    UVar7 = pUVar22[(int)uVar35];
                    pUVar22[(int)uVar35] = pUVar22[(long)(int)(uVar15 - iVar26) + 1];
                    pUVar22[(long)(int)(uVar15 - iVar26) + 1] = UVar7;
                    pUVar22 = pUVar22 + 1;
                    iVar18 = iVar18 + -1;
                  } while (1 < iVar18);
                }
                uVar31 = ((uVar9 - iVar25) + uVar35) - 1;
                uVar19 = uVar15 - iVar33;
                uVar36 = uVar19 + 1;
                uVar37 = uVar15;
                uVar27 = uVar9;
                if ((int)(uVar31 - uVar9) < (int)(uVar15 - uVar36)) {
                  uVar37 = uVar31;
                  uVar31 = uVar15;
                  uVar27 = uVar36;
                  uVar36 = uVar9;
                }
                uVar35 = (uVar9 - iVar25) + uVar35;
                uVar9 = uVar37;
                uVar15 = uVar36;
                iVar25 = iVar8 + 1;
                iVar18 = iVar8;
                if ((int)(uVar37 - uVar36) < (int)(uVar19 - uVar35)) {
                  uVar9 = uVar19;
                  uVar15 = uVar35;
                  iVar25 = iVar8;
                  uVar35 = uVar36;
                  uVar19 = uVar37;
                  iVar18 = iVar8 + 1;
                }
                uVar36 = uVar31;
                uVar37 = uVar27;
                iVar26 = iVar18;
                if ((int)(uVar31 - uVar27) < (int)(uVar9 - uVar15)) {
                  uVar36 = uVar9;
                  uVar37 = uVar15;
                  iVar26 = iVar8;
                  iVar8 = iVar18;
                  uVar15 = uVar27;
                  uVar9 = uVar31;
                }
                local_dc8[local_1270] = uVar37;
                local_f58[local_1270] = uVar36;
                local_10e8[local_1270] = iVar8;
                uVar20 = local_12d0 & 0xffffffff;
                local_dc8[uVar20] = uVar15;
                local_f58[uVar20] = uVar9;
                local_10e8[uVar20] = iVar26;
                auStack_c38[uVar20 - 99] = uVar35;
                local_f58[uVar20 + 1] = uVar19;
                local_10e8[uVar20 + 1] = iVar25;
                uVar9 = (int)local_12d0 + 2;
                pUVar23 = local_12e8;
LAB_0041ea14:
                local_12d0 = (ulong)uVar9;
                bVar40 = 0 < (int)uVar9;
              } while (0 < (int)uVar9);
LAB_0041ea28:
              local_1290 = (ulong)(((int)local_1290 - local_12bc) + (int)local_1220 + 1);
              bVar40 = -1 < (int)local_12ec;
              uVar20 = local_1238;
              pUVar21 = local_11f8;
              uVar28 = local_1230;
              pUVar22 = local_1218;
              s = local_1240;
              iVar8 = local_12d4;
            }
            lVar10 = local_1278;
            if (!bVar40) goto LAB_0041ed37;
          }
          pbVar2 = (byte *)((long)pUVar21 + uVar28 * 4 + 2);
          *pbVar2 = *pbVar2 | 0x20;
        }
        lVar16 = local_12e0;
        uVar28 = uVar28 + 1;
      } while (uVar28 != 0x100);
      if (local_11e8[lVar10] != '\0') {
        BZ2_bz__AssertH__fail(0x3ee);
        lVar10 = local_1278;
      }
      puVar13 = local_1200 + lVar10;
      lVar11 = 0;
      do {
        auStack_438[lVar11] = puVar13[-1] & 0xffdfffff;
        aiStack_838[lVar11] = (*puVar13 & 0xffdfffff) - 1;
        lVar11 = lVar11 + 1;
        puVar13 = puVar13 + 0x100;
      } while (lVar11 != 0x100);
      uVar20 = (long)(int)pUVar22[local_1250] & 0xffffffffffdfffff;
      uVar9 = auStack_438[lVar10];
      if ((int)uVar20 < (int)uVar9) {
        do {
          UVar7 = (pUVar23[uVar20] + ((int)(pUVar23[uVar20] - 1) >> 0x1f & (uint)lVar16)) - 1;
          bVar14 = pbVar38[(int)UVar7];
          if (local_11e8[bVar14] == '\0') {
            uVar9 = auStack_438[bVar14];
            auStack_438[bVar14] = uVar9 + 1;
            pUVar23[(int)uVar9] = UVar7;
          }
          uVar20 = uVar20 + 1;
          uVar9 = auStack_438[lVar10];
        } while ((long)uVar20 < (long)(int)uVar9);
      }
      iVar18 = local_1264 + 0x100;
      iVar25 = (pUVar22[iVar18] & 0xffdfffff) - 1;
      iVar8 = aiStack_838[lVar10];
      if (iVar8 < iVar25) {
        lVar16 = (long)iVar25;
        do {
          UVar7 = (pUVar23[lVar16] + ((int)(pUVar23[lVar16] - 1) >> 0x1f & (uint)local_12e0)) - 1;
          bVar14 = pbVar38[(int)UVar7];
          if (local_11e8[bVar14] == '\0') {
            iVar8 = aiStack_838[bVar14];
            aiStack_838[bVar14] = iVar8 + -1;
            pUVar23[iVar8] = UVar7;
          }
          lVar16 = lVar16 + -1;
          iVar8 = aiStack_838[lVar10];
        } while (iVar8 < lVar16);
      }
      if ((uVar9 - 1 != iVar8) && ((uVar9 != 0 || (iVar8 != (int)local_1258)))) {
        BZ2_bz__AssertH__fail(0x3ef);
        lVar10 = local_1278;
      }
      lVar16 = 0;
      do {
        pbVar2 = (byte *)((long)pUVar22 + lVar16 + lVar10 * 4 + 2);
        *pbVar2 = *pbVar2 | 0x20;
        lVar16 = lVar16 + 0x400;
      } while (lVar16 != 0x40000);
      local_11e8[lVar10] = '\x01';
      if (local_1248 != 0xff) {
        UVar7 = pUVar22[local_1250];
        uVar9 = (pUVar22[iVar18] & 0xffdfffff) - (int)((long)(int)UVar7 & 0xffffffffffdfffffU);
        bVar14 = 0xff;
        do {
          bVar14 = bVar14 + 1;
        } while (0xfffe < (int)uVar9 >> (bVar14 & 0x1f));
        if (0 < (int)uVar9) {
          uVar20 = (ulong)uVar9;
          do {
            UVar4 = local_1208[((long)(int)UVar7 & 0xffffffffffdfffffU) + uVar20];
            UVar30 = (UInt16)((uint)(uVar20 - 1) >> (bVar14 & 0x1f));
            local_12a8[(int)UVar4] = UVar30;
            if ((long)(int)UVar4 < 0x22) {
              local_12a8[(int)(UVar4 + (int)local_12e0)] = UVar30;
            }
            bVar40 = 1 < (long)uVar20;
            uVar20 = uVar20 - 1;
          } while (bVar40);
        }
        if (0xffff < (int)(uVar9 - 1) >> (bVar14 & 0x1f)) {
          BZ2_bz__AssertH__fail(0x3ea);
        }
      }
      iVar8 = local_12d4;
      lVar16 = local_1248 + 1;
    } while (lVar16 != 0x100);
    if (3 < local_12d4) {
      fprintf(_stderr,"        %d pointers, %d sorted, %d scanned\n",local_12e0,local_1290,
              (ulong)(uint)((int)local_12e0 - (int)local_1290));
    }
LAB_0041ed37:
    if (2 < iVar8) {
      BZ2_blockSort_cold_3();
    }
    if (-1 < (int)local_12ec) goto LAB_0041ed68;
    if (1 < iVar8) {
      BZ2_blockSort_cold_4();
    }
    pUVar21 = s->arr1;
    eclass = s->arr2;
    uVar9 = (uint)local_12e0;
  }
  fallbackSort(pUVar21,eclass,pUVar22,uVar9,iVar8);
LAB_0041ed68:
  s->origPtr = -1;
  if (0 < (long)s->nblock) {
    lVar16 = 0;
    do {
      if (pUVar23[lVar16] == 0) {
        s->origPtr = (Int32)lVar16;
        break;
      }
      lVar16 = lVar16 + 1;
    } while (s->nblock != lVar16);
  }
  if (s->origPtr == -1) {
    BZ2_bz__AssertH__fail(0x3eb);
    return;
  }
  return;
code_r0x0041e5cd:
  local_10e8[local_1270] = iVar8 + 1;
  if (!bVar40) goto LAB_0041ea28;
  goto LAB_0041e40d;
}

Assistant:

void BZ2_blockSort ( EState* s )
{
   UInt32* ptr    = s->ptr; 
   UChar*  block  = s->block;
   UInt32* ftab   = s->ftab;
   Int32   nblock = s->nblock;
   Int32   verb   = s->verbosity;
   Int32   wfact  = s->workFactor;
   UInt16* quadrant;
   Int32   budget;
   Int32   budgetInit;
   Int32   i;

   if (nblock < 10000) {
      fallbackSort ( s->arr1, s->arr2, ftab, nblock, verb );
   } else {
      /* Calculate the location for quadrant, remembering to get
         the alignment right.  Assumes that &(block[0]) is at least
         2-byte aligned -- this should be ok since block is really
         the first section of arr2.
      */
      i = nblock+BZ_N_OVERSHOOT;
      if (i & 1) i++;
      quadrant = (UInt16*)(&(block[i]));

      /* (wfact-1) / 3 puts the default-factor-30
         transition point at very roughly the same place as 
         with v0.1 and v0.9.0.  
         Not that it particularly matters any more, since the
         resulting compressed stream is now the same regardless
         of whether or not we use the main sort or fallback sort.
      */
      if (wfact < 1  ) wfact = 1;
      if (wfact > 100) wfact = 100;
      budgetInit = nblock * ((wfact-1) / 3);
      budget = budgetInit;

      mainSort ( ptr, block, quadrant, ftab, nblock, verb, &budget );
      if (verb >= 3) 
         VPrintf3 ( "      %d work, %d block, ratio %5.2f\n",
                    budgetInit - budget,
                    nblock, 
                    (float)(budgetInit - budget) /
                    (float)(nblock==0 ? 1 : nblock) ); 
      if (budget < 0) {
         if (verb >= 2) 
            VPrintf0 ( "    too repetitive; using fallback"
                       " sorting algorithm\n" );
         fallbackSort ( s->arr1, s->arr2, ftab, nblock, verb );
      }
   }

   s->origPtr = -1;
   for (i = 0; i < s->nblock; i++)
      if (ptr[i] == 0)
         { s->origPtr = i; break; };

   AssertH( s->origPtr != -1, 1003 );
}